

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O1

void Sfm_ComputeInterpolantCheck(Sfm_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  char *__s;
  word uTruth;
  word local_10;
  
  Sfm_NtkCreateWindow(p,3,1);
  Sfm_NtkWindowToSolver(p);
  p_00 = p->vDivIds;
  p_00->nSize = 0;
  if (6 < (p->vId2Var).nSize) {
    iVar1 = (p->vId2Var).pArray[6];
    if (0 < iVar1) {
      Vec_IntPush(p_00,iVar1);
      if ((p->vId2Var).nSize < 8) goto LAB_00532703;
      iVar1 = (p->vId2Var).pArray[7];
      if (0 < iVar1) {
        Vec_IntPush(p->vDivIds,iVar1);
        local_10 = Sfm_ComputeInterpolant(p);
        if (local_10 == 0x1234567812345678) {
          __s = "The problem is UNDEC.";
        }
        else {
          if (local_10 != 0x8765432187654321) {
            Kit_DsdPrintFromTruth((uint *)&local_10,2);
            putchar(10);
            return;
          }
          __s = "The problem is SAT.";
        }
        puts(__s);
        return;
      }
    }
    __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmInt.h"
                  ,0xa7,"int Sfm_ObjSatVar(Sfm_Ntk_t *, int)");
  }
LAB_00532703:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sfm_ComputeInterpolantCheck( Sfm_Ntk_t * p )
{
    int iNode = 3;
    int iDiv0 = 6;
    int iDiv1 = 7;
    word uTruth;
//    int i;
//    Sfm_NtkForEachNode( p, i )
    {
        Sfm_NtkCreateWindow( p, iNode, 1 );
        Sfm_NtkWindowToSolver( p );

        // collect SAT variables of divisors
        Vec_IntClear( p->vDivIds );
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iDiv0) );
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iDiv1) );

        uTruth = Sfm_ComputeInterpolant( p );

        if ( uTruth == SFM_SAT_SAT )
            printf( "The problem is SAT.\n" );
        else if ( uTruth == SFM_SAT_UNDEC )
            printf( "The problem is UNDEC.\n" );
        else
            Kit_DsdPrintFromTruth( (unsigned *)&uTruth, 2 ), printf( "\n" );
    }
}